

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O0

int Abc_TruthHashLookup(word **pFuncs,int iThis,int nWords,int *pTable,int *pNexts,int Key)

{
  int iVar1;
  int local_38;
  int iThat;
  int Key_local;
  int *pNexts_local;
  int *pTable_local;
  int nWords_local;
  int iThis_local;
  word **pFuncs_local;
  
  local_38 = pTable[Key];
  while( true ) {
    if (local_38 == -1) {
      return 0;
    }
    iVar1 = memcmp(pFuncs[local_38],pFuncs[iThis],(long)nWords << 3);
    if (iVar1 == 0) break;
    local_38 = pNexts[local_38];
  }
  return 1;
}

Assistant:

static inline int Abc_TruthHashLookup( word ** pFuncs, int iThis, int nWords, int * pTable, int * pNexts, int Key )
{
    int iThat;
    for ( iThat = pTable[Key]; iThat != -1; iThat = pNexts[iThat] )
        if ( !memcmp( pFuncs[iThat], pFuncs[iThis], sizeof(word) * nWords ) )
            return 1;
    return 0;
}